

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O2

int Mvc_CubeCompareInt(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  int i;
  uint uVar1;
  ulong uVar2;
  bool bVar4;
  bool bVar5;
  ulong uVar3;
  
  uVar1 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      if (*(uint *)&pC2->field_0x14 <= *(uint *)&pC1->field_0x14) {
        if (*(uint *)&pC2->field_0x14 < *(uint *)&pC1->field_0x14) {
          return 1;
        }
        bVar4 = pC1->pData[0] < pC2->pData[0];
        bVar5 = pC1->pData[0] == pC2->pData[0];
        if (!bVar4) goto LAB_00752d8a;
      }
    }
    else {
      while( true ) {
        if ((int)uVar1 < 0) {
          return 0;
        }
        uVar2 = (ulong)uVar1;
        uVar3 = (ulong)uVar1;
        if (pC1->pData[uVar2] < pC2->pData[uVar3]) break;
        uVar1 = uVar1 - 1;
        if (pC2->pData[uVar3] < pC1->pData[uVar2]) {
          return 1;
        }
      }
    }
    return -1;
  }
  bVar4 = pC1->pData[0] < pC2->pData[0];
  bVar5 = pC1->pData[0] == pC2->pData[0];
  if (bVar4) {
    return -1;
  }
LAB_00752d8a:
  return (int)(!bVar4 && !bVar5);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Compares two cubes according to their integer value.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
int Mvc_CubeCompareInt( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    if ( Mvc_Cube1Words(pC1) )
    {
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        if ( pC1->pData[1] < pC2->pData[1] )
            return -1;
        if ( pC1->pData[1] > pC2->pData[1] )
            return 1;
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast(pC1);
        for(; i >= 0; i--)
        {
            if ( pC1->pData[i] < pC2->pData[i] )
                return -1;
            if ( pC1->pData[i] > pC2->pData[i] )
                return 1;
        }
        return 0;
    }
}